

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULibCal.cpp
# Opt level: O0

void doMagMinMaxCal(void)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint64_t uVar4;
  char input;
  uint64_t now;
  uint64_t displayTimer;
  
  RTIMUMagCal::magCalInit();
  magMinMaxDone = false;
  printf("\n\nMagnetometer min/max calibration\n");
  printf("--------------------------------\n");
  printf("Waggle the IMU chip around, ensuring that all six axes\n");
  printf("(+x, -x, +y, -y and +z, -z) go through their extrema.\n");
  printf("When all extrema have been achieved, enter \'s\' to save, \'r\' to reset\n");
  printf("or \'x\' to abort and discard the data.\n");
  printf("\nPress any key to start...");
  getchar();
  now = RTMath::currentUSecsSinceEpoch();
  while( true ) {
    while( true ) {
      do {
        iVar3 = (**(code **)(*(long *)imu + 0x28))();
        usleep(iVar3 * 1000);
        while (bVar1 = pollIMU(), bVar1) {
          RTIMUMagCal::newMinMaxData((RTVector3 *)magCal);
          uVar4 = RTMath::currentUSecsSinceEpoch();
          if (100000 < uVar4 - now) {
            displayMagMinMax();
            now = uVar4;
          }
        }
        cVar2 = getUserChar();
      } while (cVar2 == '\0');
      if (cVar2 != 'r') break;
      printf("\nResetting min/max data.\n");
      RTIMUMagCal::magCalReset();
    }
    if (cVar2 == 's') break;
    if (cVar2 == 'x') {
      printf("\nAborting.\n");
      return;
    }
  }
  printf("\nSaving min/max data.\n\n");
  RTIMUMagCal::magCalSaveMinMax();
  magMinMaxDone = true;
  return;
}

Assistant:

void doMagMinMaxCal()
{
    uint64_t displayTimer;
    uint64_t now;
    char input;

    magCal->magCalInit();
    magMinMaxDone = false;

    //  now collect data

    printf("\n\nMagnetometer min/max calibration\n");
    printf("--------------------------------\n");
    printf("Waggle the IMU chip around, ensuring that all six axes\n");
    printf("(+x, -x, +y, -y and +z, -z) go through their extrema.\n");
    printf("When all extrema have been achieved, enter 's' to save, 'r' to reset\n");
    printf("or 'x' to abort and discard the data.\n");
    printf("\nPress any key to start...");
    getchar();

    displayTimer = RTMath::currentUSecsSinceEpoch();

    while (1) {
        //  poll at the rate recommended by the IMU

        usleep(imu->IMUGetPollInterval() * 1000);

        while (pollIMU()) {
            magCal->newMinMaxData(imuData.compass);
            now = RTMath::currentUSecsSinceEpoch();

            //  display 10 times per second

            if ((now - displayTimer) > 100000) {
                displayMagMinMax();
                displayTimer = now;
            }
        }

        if ((input = getUserChar()) != 0) {
            switch (input) {
            case 's' :
                printf("\nSaving min/max data.\n\n");
                magCal->magCalSaveMinMax();
                magMinMaxDone = true;
                return;

            case 'x' :
                printf("\nAborting.\n");
                return;

            case 'r' :
                printf("\nResetting min/max data.\n");
                magCal->magCalReset();
                break;
            }
        }
    }
}